

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<spvc_entry_point,_8UL> * __thiscall
spirv_cross::SmallVector<spvc_entry_point,_8UL>::operator=
          (SmallVector<spvc_entry_point,_8UL> *this,SmallVector<spvc_entry_point,_8UL> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  spvc_entry_point *__ptr;
  size_t sVar3;
  undefined8 uVar4;
  spvc_entry_point *psVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  (this->super_VectorView<spvc_entry_point>).buffer_size = 0;
  psVar5 = (other->super_VectorView<spvc_entry_point>).ptr;
  if (psVar5 == (spvc_entry_point *)&other->stack_storage) {
    reserve(this,(other->super_VectorView<spvc_entry_point>).buffer_size);
    if ((other->super_VectorView<spvc_entry_point>).buffer_size == 0) {
      uVar8 = 0;
    }
    else {
      lVar6 = 0;
      uVar7 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)&((other->super_VectorView<spvc_entry_point>).ptr)->execution_model + lVar6)
        ;
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&((this->super_VectorView<spvc_entry_point>).ptr)->execution_model + lVar6);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        uVar7 = uVar7 + 1;
        uVar8 = (other->super_VectorView<spvc_entry_point>).buffer_size;
        lVar6 = lVar6 + 0x10;
      } while (uVar7 < uVar8);
    }
    (this->super_VectorView<spvc_entry_point>).buffer_size = uVar8;
    (other->super_VectorView<spvc_entry_point>).buffer_size = 0;
  }
  else {
    __ptr = (this->super_VectorView<spvc_entry_point>).ptr;
    if (__ptr != (spvc_entry_point *)&this->stack_storage) {
      free(__ptr);
      psVar5 = (other->super_VectorView<spvc_entry_point>).ptr;
    }
    (this->super_VectorView<spvc_entry_point>).ptr = psVar5;
    sVar3 = other->buffer_capacity;
    (this->super_VectorView<spvc_entry_point>).buffer_size =
         (other->super_VectorView<spvc_entry_point>).buffer_size;
    this->buffer_capacity = sVar3;
    (other->super_VectorView<spvc_entry_point>).ptr = (spvc_entry_point *)0x0;
    (other->super_VectorView<spvc_entry_point>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}